

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

double orient2dadapt(double *pa,double *pb,double *pc,double detsum)

{
  int eindex;
  int iVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double Q;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double B [4];
  double u [4];
  double D [16];
  double C1 [8];
  double C2 [12];
  double local_1c8 [4];
  double local_1a8;
  undefined8 uStack_1a0;
  double local_198;
  undefined8 uStack_190;
  double local_188;
  undefined8 uStack_180;
  double local_178;
  undefined8 uStack_170;
  double local_168;
  undefined8 uStack_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140 [17];
  double local_b8 [8];
  double local_78 [12];
  
  dVar7 = splitter;
  dVar20 = *pa;
  dVar18 = pa[1];
  dVar22 = *pc;
  dVar23 = pc[1];
  dVar10 = dVar20 - dVar22;
  dVar16 = pb[1];
  dVar3 = dVar16 - dVar23;
  dVar15 = dVar10 * dVar3;
  local_168 = dVar10 * splitter - (dVar10 * splitter - dVar10);
  dVar11 = dVar10 - local_168;
  dVar6 = splitter * dVar3 - (splitter * dVar3 - dVar3);
  dVar8 = dVar3 - dVar6;
  dVar14 = dVar11 * dVar8 - (((dVar15 - local_168 * dVar6) - dVar11 * dVar6) - local_168 * dVar8);
  dVar4 = dVar18 - dVar23;
  local_188 = dVar4 * splitter - (dVar4 * splitter - dVar4);
  dVar5 = *pb;
  dVar9 = dVar5 - dVar22;
  dVar12 = dVar9 * splitter - (dVar9 * splitter - dVar9);
  dVar17 = dVar9 * dVar4;
  local_178 = dVar4 - local_188;
  dVar13 = dVar9 - dVar12;
  dVar19 = local_178 * dVar13 -
           (((dVar17 - local_188 * dVar12) - local_178 * dVar12) - local_188 * dVar13);
  dVar21 = dVar14 - dVar19;
  local_1c8[0] = (dVar14 - (dVar21 + (dVar14 - dVar21))) + ((dVar14 - dVar21) - dVar19);
  dVar19 = dVar15 + dVar21;
  dVar14 = (dVar15 - (dVar19 - (dVar19 - dVar15))) + (dVar21 - (dVar19 - dVar15));
  dVar15 = dVar14 - dVar17;
  local_1c8[1] = (dVar14 - (dVar15 + (dVar14 - dVar15))) + ((dVar14 - dVar15) - dVar17);
  local_1c8[3] = dVar19 + dVar15;
  local_1c8[2] = (dVar19 - (local_1c8[3] - (local_1c8[3] - dVar19))) +
                 (dVar15 - (local_1c8[3] - dVar19));
  local_168 = -local_168;
  uStack_160 = 0x8000000000000000;
  local_1a8 = -dVar11;
  local_188 = -local_188;
  uStack_180 = 0x8000000000000000;
  uStack_170 = 0;
  local_198 = -local_178;
  lVar2 = 1;
  dVar14 = local_1c8[0];
  do {
    dVar14 = dVar14 + local_1c8[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  if ((dVar14 < ccwerrboundB * detsum) && (-dVar14 < ccwerrboundB * detsum)) {
    uStack_1a0 = 0x8000000000000000;
    uStack_190 = 0x8000000000000000;
    dVar20 = (dVar20 - (dVar10 + (dVar20 - dVar10))) + ((dVar20 - dVar10) - dVar22);
    dVar22 = (dVar5 - (dVar9 + (dVar5 - dVar9))) + ((dVar5 - dVar9) - dVar22);
    dVar18 = (dVar18 - (dVar4 + (dVar18 - dVar4))) + ((dVar18 - dVar4) - dVar23);
    dVar23 = (dVar16 - (dVar3 + (dVar16 - dVar3))) + ((dVar16 - dVar3) - dVar23);
    if ((((dVar20 != 0.0) ||
         ((((NAN(dVar20) || (dVar18 != 0.0)) || (NAN(dVar18))) || ((dVar22 != 0.0 || (NAN(dVar22))))
          ))) || (dVar23 != 0.0)) || (NAN(dVar23))) {
      dVar16 = detsum * ccwerrboundC + ABS(dVar14) * resulterrbound;
      dVar3 = dVar3 * dVar20;
      dVar10 = dVar10 * dVar23;
      dVar9 = dVar9 * dVar18;
      dVar4 = dVar4 * dVar22;
      dVar14 = ((dVar10 + dVar3) - (dVar4 + dVar9)) + dVar14;
      if ((dVar14 < dVar16) && (-dVar14 < dVar16)) {
        dVar5 = splitter * dVar20 - (splitter * dVar20 - dVar20);
        dVar15 = dVar20 - dVar5;
        dVar16 = dVar8 * dVar15 - (((dVar3 - dVar5 * dVar6) - dVar6 * dVar15) - dVar5 * dVar8);
        dVar14 = splitter * dVar18 - (splitter * dVar18 - dVar18);
        dVar8 = dVar18 - dVar14;
        dVar12 = dVar13 * dVar8 - (((dVar9 - dVar14 * dVar12) - dVar12 * dVar8) - dVar14 * dVar13);
        dVar6 = dVar16 - dVar12;
        local_158 = (dVar16 - (dVar6 + (dVar16 - dVar6))) + ((dVar16 - dVar6) - dVar12);
        dVar16 = dVar3 + dVar6;
        dVar6 = (dVar3 - (dVar16 - (dVar16 - dVar3))) + (dVar6 - (dVar16 - dVar3));
        dVar3 = dVar6 - dVar9;
        local_150 = (dVar6 - (dVar3 + (dVar6 - dVar3))) + ((dVar6 - dVar3) - dVar9);
        local_140[0] = dVar16 + dVar3;
        local_148 = (dVar16 - (local_140[0] - (local_140[0] - dVar16))) +
                    (dVar3 - (local_140[0] - dVar16));
        iVar1 = fast_expansion_sum_zeroelim(4,local_1c8,4,&local_158,local_b8);
        dVar6 = dVar7 * dVar23;
        dVar6 = dVar6 - (dVar6 - dVar23);
        dVar12 = dVar23 - dVar6;
        dVar16 = dVar11 * dVar12 -
                 (local_168 * dVar12 + local_1a8 * dVar6 + local_168 * dVar6 + dVar10);
        dVar7 = dVar7 * dVar22;
        dVar7 = dVar7 - (dVar7 - dVar22);
        dVar9 = dVar22 - dVar7;
        dVar11 = local_178 * dVar9 -
                 (local_188 * dVar9 + local_198 * dVar7 + local_188 * dVar7 + dVar4);
        dVar3 = dVar16 - dVar11;
        local_158 = (dVar16 - (dVar3 + (dVar16 - dVar3))) + ((dVar16 - dVar3) - dVar11);
        dVar16 = dVar10 + dVar3;
        dVar10 = (dVar10 - (dVar16 - (dVar16 - dVar10))) + (dVar3 - (dVar16 - dVar10));
        dVar3 = dVar10 - dVar4;
        local_150 = (dVar10 - (dVar3 + (dVar10 - dVar3))) + ((dVar10 - dVar3) - dVar4);
        local_140[0] = dVar16 + dVar3;
        local_148 = (dVar16 - (local_140[0] - (local_140[0] - dVar16))) +
                    (dVar3 - (local_140[0] - dVar16));
        iVar1 = fast_expansion_sum_zeroelim(iVar1,local_b8,4,&local_158,local_78);
        dVar20 = dVar20 * dVar23;
        dVar16 = dVar12 * dVar15 - (((dVar20 - dVar5 * dVar6) - dVar6 * dVar15) - dVar5 * dVar12);
        dVar22 = dVar22 * dVar18;
        dVar18 = dVar9 * dVar8 - (((dVar22 - dVar14 * dVar7) - dVar7 * dVar8) - dVar14 * dVar9);
        dVar23 = dVar16 - dVar18;
        local_158 = (dVar16 - (dVar23 + (dVar16 - dVar23))) + ((dVar16 - dVar23) - dVar18);
        dVar18 = dVar20 + dVar23;
        dVar23 = (dVar20 - (dVar18 - (dVar18 - dVar20))) + (dVar23 - (dVar18 - dVar20));
        dVar20 = dVar23 - dVar22;
        local_150 = (dVar23 - (dVar20 + (dVar23 - dVar20))) + ((dVar23 - dVar20) - dVar22);
        local_140[0] = dVar18 + dVar20;
        local_148 = (dVar18 - (local_140[0] - (local_140[0] - dVar18))) +
                    (dVar20 - (local_140[0] - dVar18));
        iVar1 = fast_expansion_sum_zeroelim(iVar1,local_78,4,&local_158,local_140 + 1);
        dVar14 = local_140[iVar1];
      }
    }
  }
  return dVar14;
}

Assistant:

REAL orient2dadapt(REAL *pa, REAL *pb, REAL *pc, REAL detsum)
{
  INEXACT REAL acx, acy, bcx, bcy;
  REAL acxtail, acytail, bcxtail, bcytail;
  INEXACT REAL detleft, detright;
  REAL detlefttail, detrighttail;
  REAL det, errbound;
  REAL B[4], C1[8], C2[12], D[16];
  INEXACT REAL B3;
  int C1length, C2length, Dlength;
  REAL u[4];
  INEXACT REAL u3;
  INEXACT REAL s1, t1;
  REAL s0, t0;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;

  acx = (REAL) (pa[0] - pc[0]);
  bcx = (REAL) (pb[0] - pc[0]);
  acy = (REAL) (pa[1] - pc[1]);
  bcy = (REAL) (pb[1] - pc[1]);

  Two_Product(acx, bcy, detleft, detlefttail);
  Two_Product(acy, bcx, detright, detrighttail);

  Two_Two_Diff(detleft, detlefttail, detright, detrighttail,
               B3, B[2], B[1], B[0]);
  B[3] = B3;

  det = estimate(4, B);
  errbound = ccwerrboundB * detsum;
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  Two_Diff_Tail(pa[0], pc[0], acx, acxtail);
  Two_Diff_Tail(pb[0], pc[0], bcx, bcxtail);
  Two_Diff_Tail(pa[1], pc[1], acy, acytail);
  Two_Diff_Tail(pb[1], pc[1], bcy, bcytail);

  if ((acxtail == 0.0) && (acytail == 0.0)
      && (bcxtail == 0.0) && (bcytail == 0.0)) {
    return det;
  }

  errbound = ccwerrboundC * detsum + resulterrbound * Absolute(det);
  det += (acx * bcytail + bcy * acxtail)
       - (acy * bcxtail + bcx * acytail);
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  Two_Product(acxtail, bcy, s1, s0);
  Two_Product(acytail, bcx, t1, t0);
  Two_Two_Diff(s1, s0, t1, t0, u3, u[2], u[1], u[0]);
  u[3] = u3;
  C1length = fast_expansion_sum_zeroelim(4, B, 4, u, C1);

  Two_Product(acx, bcytail, s1, s0);
  Two_Product(acy, bcxtail, t1, t0);
  Two_Two_Diff(s1, s0, t1, t0, u3, u[2], u[1], u[0]);
  u[3] = u3;
  C2length = fast_expansion_sum_zeroelim(C1length, C1, 4, u, C2);

  Two_Product(acxtail, bcytail, s1, s0);
  Two_Product(acytail, bcxtail, t1, t0);
  Two_Two_Diff(s1, s0, t1, t0, u3, u[2], u[1], u[0]);
  u[3] = u3;
  Dlength = fast_expansion_sum_zeroelim(C2length, C2, 4, u, D);

  return(D[Dlength - 1]);
}